

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jtalk.c
# Opt level: O2

_Bool has_driveletter(char *path)

{
  return false;
}

Assistant:

bool has_driveletter(const char *path)
{
#if defined(_WIN32)
	char ch = path[0];
	return path[1] == ':' && ((ch >= 'A' && ch <= 'Z') || (ch >= 'a' && ch <= 'z'));
#else
	return false;
#endif
}